

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

ggml_tensor * ggml_set_i32(ggml_tensor *tensor,int32_t value)

{
  ggml_type gVar1;
  int n;
  size_t sVar2;
  ggml_bf16_t v;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ggml_bf16_t *x;
  undefined4 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  
  uVar3 = ggml_nrows();
  gVar1 = tensor->type;
  n = (int)tensor->ne[0];
  sVar2 = tensor->nb[1];
  x = (ggml_bf16_t *)tensor->data;
  uVar4 = (int)uVar3 >> 0x1f;
  switch(gVar1) {
  case GGML_TYPE_I8:
    uVar5 = (ulong)(~uVar4 & uVar3);
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      ggml_vec_set_i8(n,(int8_t *)x,(int8_t)value);
      x = (ggml_bf16_t *)((long)&x->bits + sVar2);
    }
    break;
  case GGML_TYPE_I16:
    uVar5 = (ulong)(~uVar4 & uVar3);
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      ggml_vec_set_i16(n,(int16_t *)x,(int16_t)value);
      x = (ggml_bf16_t *)((long)&x->bits + sVar2);
    }
    break;
  case GGML_TYPE_I32:
    uVar5 = (ulong)(~uVar4 & uVar3);
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      ggml_vec_set_i32(n,(int32_t *)x,value);
      x = (ggml_bf16_t *)((long)&x->bits + sVar2);
    }
    break;
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
switchD_0010c941_caseD_1b:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x340,"fatal error");
  case GGML_TYPE_BF16:
    uVar5 = (ulong)(~uVar4 & uVar3);
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      v = ggml_compute_fp32_to_bf16((float)value);
      ggml_vec_set_bf16(n,x,v);
      x = (ggml_bf16_t *)((long)&x->bits + sVar2);
    }
    break;
  default:
    if (gVar1 == GGML_TYPE_F32) {
      uVar5 = (ulong)(~uVar4 & uVar3);
      while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
        ggml_vec_set_f32(n,(float *)x,(float)value);
        x = (ggml_bf16_t *)((long)&x->bits + sVar2);
      }
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto switchD_0010c941_caseD_1b;
      auVar8._0_4_ = (float)value;
      uVar5 = (ulong)(~uVar4 & uVar3);
      auVar8._4_8_ = SUB128(ZEXT812(0),4);
      auVar8._12_4_ = 0;
      auVar8 = vcvtps2ph_f16c(auVar8,0);
      uVar6 = vpextrw_avx(auVar8,0);
      while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
        ggml_vec_set_f16(n,&x->bits,(ggml_fp16_t)uVar6);
        x = (ggml_bf16_t *)((long)&x->bits + sVar2);
      }
    }
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_i32 (struct ggml_tensor * tensor, int32_t value) {
    const int n     = ggml_nrows(tensor);
    const int nc    = tensor->ne[0];
    const size_t n1 = tensor->nb[1];

    char * const data = tensor->data;

    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                assert(tensor->nb[0] == sizeof(int8_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i8(nc, (int8_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I16:
            {
                assert(tensor->nb[0] == sizeof(int16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i16(nc, (int16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I32:
            {
                assert(tensor->nb[0] == sizeof(int32_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i32(nc, (int32_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F16:
            {
                assert(tensor->nb[0] == sizeof(ggml_fp16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f16(nc, (ggml_fp16_t *)(data + i*n1), GGML_FP32_TO_FP16(value));
                }
            } break;
        case GGML_TYPE_BF16:
            {
                assert(tensor->nb[0] == sizeof(ggml_fp16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_bf16(nc, (ggml_bf16_t *)(data + i*n1), GGML_FP32_TO_BF16(value));
                }
            } break;
        case GGML_TYPE_F32:
            {
                assert(tensor->nb[0] == sizeof(float));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f32(nc, (float *)(data + i*n1), value);
                }
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }

    return tensor;
}